

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_Test::testBody
          (TEST_MockCheckedActualCall_unExpectedParameterName_Test *this)

{
  MockExpectedCallsList *pMVar1;
  MockActualCall *pMVar2;
  UtestShell *test;
  MockUnexpectedInputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockCheckedActualCall actualCall;
  MockCheckedExpectedCall call1;
  SimpleString local_1d0;
  TestFailure local_1c0;
  MockNamedValue local_158;
  MockCheckedActualCall local_108;
  MockCheckedExpectedCall local_b0;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall(&local_b0);
  SimpleString::SimpleString((SimpleString *)&local_1c0,"func");
  MockCheckedExpectedCall::withName(&local_b0,(SimpleString *)&local_1c0);
  SimpleString::~SimpleString((SimpleString *)&local_1c0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list;
  (*pMVar1->_vptr_MockExpectedCallsList[0xc])(pMVar1,&local_b0);
  MockCheckedActualCall::MockCheckedActualCall
            (&local_108,1,(this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::SimpleString((SimpleString *)&local_1c0,"func");
  pMVar2 = MockCheckedActualCall::withName(&local_108,(SimpleString *)&local_1c0);
  SimpleString::SimpleString((SimpleString *)&local_158,"integer");
  (*pMVar2->_vptr_MockActualCall[8])(pMVar2,&local_158,1);
  SimpleString::~SimpleString((SimpleString *)&local_158);
  SimpleString::~SimpleString((SimpleString *)&local_1c0);
  SimpleString::SimpleString((SimpleString *)&local_1c0,"integer");
  MockNamedValue::MockNamedValue(&local_158,(SimpleString *)&local_1c0);
  SimpleString::~SimpleString((SimpleString *)&local_1c0);
  MockNamedValue::setValue(&local_158,1);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_1d0,"func");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)&local_1c0,test,&local_1d0,&local_158,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_1d0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x79);
  TestFailure::~TestFailure(&local_1c0);
  MockNamedValue::~MockNamedValue(&local_158);
  MockCheckedActualCall::~MockCheckedActualCall(&local_108);
  MockCheckedExpectedCall::~MockCheckedExpectedCall(&local_b0);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}